

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerators::ChecksumedPath
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,string *sourceFile,
          string *basePrefix,string *baseSuffix)

{
  string local_40;
  
  cmFilePathChecksum::getPart(__return_storage_ptr__,&this->FPathChecksum,sourceFile,10);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_40,sourceFile);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ChecksumedPath(
  const std::string& sourceFile, const std::string& basePrefix,
  const std::string& baseSuffix) const
{
  std::string res = FPathChecksum.getPart(sourceFile);
  res += "/";
  res += basePrefix;
  res += cmsys::SystemTools::GetFilenameWithoutLastExtension(sourceFile);
  res += baseSuffix;
  return res;
}